

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O0

void __thiscall
bv::internal::bitview<std::vector>::set
          (bitview<std::vector> *this,size_t begin,size_t end,word_type value)

{
  bool bVar1;
  size_t begin_00;
  bitview<std::vector> *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  word_type bits;
  range_location_t loc;
  size_t len;
  unsigned_long in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  unsigned_long *in_stack_ffffffffffffffd0;
  
  bVar1 = is_empty_range(in_RSI,in_RDX);
  if (!bVar1) {
    begin_00 = in_RDX - in_RSI;
    size((bitview<std::vector> *)0x163fd8);
    check_valid_range(in_RDX,in_RSI,0x163fe9);
    ensure_bitsize<unsigned_long,void>(in_RDX,in_RSI);
    locate(in_RCX,begin_00,(size_t)in_stack_ffffffffffffffd0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (in_RDI,in_stack_ffffffffffffffb8);
    set_bitfield<unsigned_long>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffd0 != (unsigned_long *)0x0) {
      bitfield<unsigned_long,void>((unsigned_long)in_RDI,in_RDX,in_RSI);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (in_RDI,in_stack_ffffffffffffffb8 + 1);
      set_bitfield<unsigned_long>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void bitview<Container>::set(size_t begin, size_t end, word_type value)
        {
            if(is_empty_range(begin, end))
                return;
            
            size_t len = end - begin;
            
            assert(len <= W);
            check_valid_range(begin, end, size());
            ensure_bitsize(value, len);
            
            range_location_t loc = locate(begin, end);
            
            set_bitfield(_container[loc.index],
                         loc.lbegin, loc.lbegin + loc.llen, value);
            
            if(loc.hlen != 0) {
                word_type bits = bitfield(value, loc.llen, loc.llen + loc.hlen);
                set_bitfield(_container[loc.index + 1], 0, loc.hlen, bits);
            }
        }